

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O2

int ndn_forwarder_register_face(ndn_face_intf_t *face)

{
  ndn_table_id_t nVar1;
  int iVar2;
  
  if (face != (ndn_face_intf_t *)0x0) {
    if (face->face_id == 0xffff) {
      nVar1 = ndn_facetab_register(forwarder.facetab,face);
      face->face_id = nVar1;
      iVar2 = -0x33;
      if (nVar1 != 0xffff) {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = -0x32;
    }
    return iVar2;
  }
  return -0x10;
}

Assistant:

int
ndn_forwarder_register_face(ndn_face_intf_t* face)
{
  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id != NDN_INVALID_ID)
    return NDN_FWD_NO_EFFECT;
  face->face_id = ndn_facetab_register(forwarder.facetab, face);
  if(face->face_id == NDN_INVALID_ID)
    return NDN_FWD_FACE_TABLE_FULL;
  return NDN_SUCCESS;
}